

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_saveg.cpp
# Opt level: O3

void __thiscall extsector_t::Serialize(extsector_t *this,FArchive *arc)

{
  uint *puVar1;
  FLinkedSector *pFVar2;
  DWORD DVar3;
  FArchive *pFVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  
  if (arc->m_Storing == true) {
    FArchive::WriteCount(arc,(this->FakeFloor).Sectors.Count);
    DVar3 = (this->FakeFloor).Sectors.Count;
  }
  else {
    DVar3 = FArchive::ReadCount(arc);
    puVar1 = &(this->FakeFloor).Sectors.Count;
    uVar5 = DVar3 - *puVar1;
    if (*puVar1 <= DVar3 && uVar5 != 0) {
      TArray<sector_t_*,_sector_t_*>::Grow((TArray<sector_t_*,_sector_t_*> *)this,uVar5);
    }
    (this->FakeFloor).Sectors.Count = DVar3;
  }
  if (DVar3 != 0) {
    lVar7 = 0;
    uVar6 = 0;
    do {
      ::operator<<(arc,(sector_t **)((long)(this->FakeFloor).Sectors.Array + lVar7));
      uVar6 = uVar6 + 1;
      lVar7 = lVar7 + 8;
    } while (uVar6 < (this->FakeFloor).Sectors.Count);
  }
  if (arc->m_Storing == true) {
    FArchive::WriteCount(arc,(this->Midtex).Floor.AttachedLines.Count);
    DVar3 = (this->Midtex).Floor.AttachedLines.Count;
  }
  else {
    DVar3 = FArchive::ReadCount(arc);
    puVar1 = &(this->Midtex).Floor.AttachedLines.Count;
    uVar5 = DVar3 - *puVar1;
    if (*puVar1 <= DVar3 && uVar5 != 0) {
      TArray<line_t_*,_line_t_*>::Grow(&(this->Midtex).Floor.AttachedLines,uVar5);
    }
    (this->Midtex).Floor.AttachedLines.Count = DVar3;
  }
  if (DVar3 != 0) {
    lVar7 = 0;
    uVar6 = 0;
    do {
      ::operator<<(arc,(line_t **)((long)(this->Midtex).Floor.AttachedLines.Array + lVar7));
      uVar6 = uVar6 + 1;
      lVar7 = lVar7 + 8;
    } while (uVar6 < (this->Midtex).Floor.AttachedLines.Count);
  }
  if (arc->m_Storing == true) {
    FArchive::WriteCount(arc,(this->Midtex).Floor.AttachedSectors.Count);
    DVar3 = (this->Midtex).Floor.AttachedSectors.Count;
  }
  else {
    DVar3 = FArchive::ReadCount(arc);
    puVar1 = &(this->Midtex).Floor.AttachedSectors.Count;
    uVar5 = DVar3 - *puVar1;
    if (*puVar1 <= DVar3 && uVar5 != 0) {
      TArray<sector_t_*,_sector_t_*>::Grow((TArray<sector_t_*,_sector_t_*> *)&this->Midtex,uVar5);
    }
    (this->Midtex).Floor.AttachedSectors.Count = DVar3;
  }
  if (DVar3 != 0) {
    lVar7 = 0;
    uVar6 = 0;
    do {
      ::operator<<(arc,(sector_t **)((long)(this->Midtex).Floor.AttachedSectors.Array + lVar7));
      uVar6 = uVar6 + 1;
      lVar7 = lVar7 + 8;
    } while (uVar6 < (this->Midtex).Floor.AttachedSectors.Count);
  }
  if (arc->m_Storing == true) {
    FArchive::WriteCount(arc,(this->Midtex).Ceiling.AttachedLines.Count);
    DVar3 = (this->Midtex).Ceiling.AttachedLines.Count;
  }
  else {
    DVar3 = FArchive::ReadCount(arc);
    puVar1 = &(this->Midtex).Ceiling.AttachedLines.Count;
    uVar5 = DVar3 - *puVar1;
    if (*puVar1 <= DVar3 && uVar5 != 0) {
      TArray<line_t_*,_line_t_*>::Grow(&(this->Midtex).Ceiling.AttachedLines,uVar5);
    }
    (this->Midtex).Ceiling.AttachedLines.Count = DVar3;
  }
  if (DVar3 != 0) {
    lVar7 = 0;
    uVar6 = 0;
    do {
      ::operator<<(arc,(line_t **)((long)(this->Midtex).Ceiling.AttachedLines.Array + lVar7));
      uVar6 = uVar6 + 1;
      lVar7 = lVar7 + 8;
    } while (uVar6 < (this->Midtex).Ceiling.AttachedLines.Count);
  }
  if (arc->m_Storing == true) {
    FArchive::WriteCount(arc,(this->Midtex).Ceiling.AttachedSectors.Count);
    DVar3 = (this->Midtex).Ceiling.AttachedSectors.Count;
  }
  else {
    DVar3 = FArchive::ReadCount(arc);
    puVar1 = &(this->Midtex).Ceiling.AttachedSectors.Count;
    uVar5 = DVar3 - *puVar1;
    if (*puVar1 <= DVar3 && uVar5 != 0) {
      TArray<sector_t_*,_sector_t_*>::Grow(&(this->Midtex).Ceiling.AttachedSectors,uVar5);
    }
    (this->Midtex).Ceiling.AttachedSectors.Count = DVar3;
  }
  if (DVar3 != 0) {
    lVar7 = 0;
    uVar6 = 0;
    do {
      ::operator<<(arc,(sector_t **)((long)(this->Midtex).Ceiling.AttachedSectors.Array + lVar7));
      uVar6 = uVar6 + 1;
      lVar7 = lVar7 + 8;
    } while (uVar6 < (this->Midtex).Ceiling.AttachedSectors.Count);
  }
  if (arc->m_Storing == true) {
    FArchive::WriteCount(arc,(this->Linked).Floor.Sectors.Count);
    DVar3 = (this->Linked).Floor.Sectors.Count;
  }
  else {
    DVar3 = FArchive::ReadCount(arc);
    puVar1 = &(this->Linked).Floor.Sectors.Count;
    uVar5 = DVar3 - *puVar1;
    if (*puVar1 <= DVar3 && uVar5 != 0) {
      TArray<FLinkedSector,_FLinkedSector>::Grow
                ((TArray<FLinkedSector,_FLinkedSector> *)&this->Linked,uVar5);
    }
    (this->Linked).Floor.Sectors.Count = DVar3;
  }
  if (DVar3 != 0) {
    lVar7 = 8;
    uVar6 = 0;
    do {
      pFVar2 = (this->Linked).Floor.Sectors.Array;
      pFVar4 = ::operator<<(arc,(sector_t **)((long)pFVar2 + lVar7 + -8));
      FArchive::operator<<(pFVar4,(DWORD *)((long)&pFVar2->Sector + lVar7));
      uVar6 = uVar6 + 1;
      lVar7 = lVar7 + 0x10;
    } while (uVar6 < (this->Linked).Floor.Sectors.Count);
  }
  if (arc->m_Storing == true) {
    FArchive::WriteCount(arc,(this->Linked).Ceiling.Sectors.Count);
    DVar3 = (this->Linked).Ceiling.Sectors.Count;
  }
  else {
    DVar3 = FArchive::ReadCount(arc);
    puVar1 = &(this->Linked).Ceiling.Sectors.Count;
    uVar5 = DVar3 - *puVar1;
    if (*puVar1 <= DVar3 && uVar5 != 0) {
      TArray<FLinkedSector,_FLinkedSector>::Grow(&(this->Linked).Ceiling.Sectors,uVar5);
    }
    (this->Linked).Ceiling.Sectors.Count = DVar3;
  }
  if (DVar3 != 0) {
    lVar7 = 8;
    uVar6 = 0;
    do {
      pFVar2 = (this->Linked).Ceiling.Sectors.Array;
      pFVar4 = ::operator<<(arc,(sector_t **)((long)pFVar2 + lVar7 + -8));
      FArchive::operator<<(pFVar4,(DWORD *)((long)&pFVar2->Sector + lVar7));
      uVar6 = uVar6 + 1;
      lVar7 = lVar7 + 0x10;
    } while (uVar6 < (this->Linked).Ceiling.Sectors.Count);
  }
  return;
}

Assistant:

void extsector_t::Serialize(FArchive &arc)
{
	arc << FakeFloor.Sectors
		<< Midtex.Floor.AttachedLines 
		<< Midtex.Floor.AttachedSectors
		<< Midtex.Ceiling.AttachedLines
		<< Midtex.Ceiling.AttachedSectors
		<< Linked.Floor.Sectors
		<< Linked.Ceiling.Sectors;
}